

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O0

int __thiscall CharFieldSourceString::arraylen(CharFieldSourceString *this,CVmPackType *t)

{
  size_t sVar1;
  int iVar2;
  utf8_ptr *this_00;
  undefined4 *in_RSI;
  long in_RDI;
  size_t in_stack_ffffffffffffffc8;
  utf8_ptr *in_stack_ffffffffffffffd0;
  int local_4;
  
  switch(*in_RSI) {
  case 0x41:
  case 0x61:
  case 0x62:
    sVar1 = utf8_ptr::len(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    local_4 = (int)sVar1;
    break;
  default:
    local_4 = 0;
    break;
  case 0x48:
  case 0x68:
    if (in_RSI[10] == 0) {
      sVar1 = utf8_ptr::len(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      local_4 = (int)sVar1;
    }
    else {
      sVar1 = utf8_ptr::len(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      local_4 = (int)(sVar1 + 1 >> 1);
    }
    break;
  case 0x55:
  case 0x75:
    local_4 = (int)*(undefined8 *)(in_RDI + 0x10);
    break;
  case 0x57:
  case 0x77:
    iVar2 = 1;
    if (in_RSI[10] != 0) {
      iVar2 = 2;
    }
    this_00 = (utf8_ptr *)(long)iVar2;
    sVar1 = utf8_ptr::len(this_00,in_stack_ffffffffffffffc8);
    local_4 = (int)this_00 * (int)sVar1;
  }
  return local_4;
}

Assistant:

virtual int arraylen(CVmPackType *t)
    {
        switch (t->type_code)
        {
        case 'a':
        case 'A':
        case 'b':
            /* the length is in bytes, and we write one byte per character */
            return p.len(len);

        case 'w':
        case 'W':
            /* 
             *   the default length is in characters; if counting in bytes,
             *   we need two bytes per character 
             */
            return (t->count_in_bytes ? 2 : 1) * p.len(len);
            
        case 'h':
        case 'H':
            /* 
             *   the length is in source nibbles, one nibble per character;
             *   in bytes, we need half as many bytes as characters, rounded
             *   up 
             */
            return t->count_in_bytes ? (p.len(len)+1)/2 : p.len(len);

        case 'u':
        case 'U':
            /* 
             *   the length is in bytes, in UTF-8 format; this is the same
             *   format as our underlying string, so we can simply return its
             *   byte length 
             */
            return len;

        default:
            return 0;
        }
    }